

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IterSetOutputs_Full(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  Fts5Colset *pColset;
  Fts5Index *pFVar1;
  int iVar2;
  int iVar3;
  u32 nData;
  int iVar4;
  u8 *puVar5;
  int i;
  long lVar6;
  u8 *a;
  u8 *local_48;
  Fts5Buffer *local_40;
  u8 *local_38;
  
  pColset = pIter->pColset;
  (pIter->base).iRowid = pSeg->iRowid;
  iVar2 = pSeg->nPos;
  if (pSeg->pLeaf->szLeaf < iVar2 + pSeg->iLeafOffset) {
    (pIter->poslist).n = 0;
    fts5SegiterPoslist(pIter->pIndex,pSeg,pColset,&pIter->poslist);
    (pIter->base).pData = (pIter->poslist).p;
    (pIter->base).nData = (pIter->poslist).n;
  }
  else {
    puVar5 = pSeg->pLeaf->p + pSeg->iLeafOffset;
    iVar3 = pColset->nCol;
    local_38 = puVar5;
    if (iVar3 == 1) {
      iVar2 = fts5IndexExtractCol(&local_38,iVar2,pColset->aiCol[0]);
      (pIter->base).nData = iVar2;
      (pIter->base).pData = local_38;
    }
    else {
      pFVar1 = pIter->pIndex;
      (pIter->poslist).n = 0;
      iVar4 = 0;
      if (pFVar1->rc == 0) {
        local_40 = &pIter->poslist;
        for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
          local_48 = puVar5;
          nData = fts5IndexExtractCol(&local_48,iVar2,pColset->aiCol[lVar6]);
          if (nData != 0) {
            sqlite3Fts5BufferAppendBlob(&pFVar1->rc,local_40,nData,local_48);
          }
          iVar3 = pColset->nCol;
        }
        iVar4 = (pIter->poslist).n;
      }
      (pIter->base).pData = (pIter->poslist).p;
      (pIter->base).nData = iVar4;
    }
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Full(Fts5Iter *pIter, Fts5SegIter *pSeg){
  Fts5Colset *pColset = pIter->pColset;
  pIter->base.iRowid = pSeg->iRowid;

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_FULL );
  assert( pColset );

  if( pSeg->iLeafOffset+pSeg->nPos<=pSeg->pLeaf->szLeaf ){
    /* All data is stored on the current page. Populate the output 
    ** variables to point into the body of the page object. */
    const u8 *a = &pSeg->pLeaf->p[pSeg->iLeafOffset];
    if( pColset->nCol==1 ){
      pIter->base.nData = fts5IndexExtractCol(&a, pSeg->nPos,pColset->aiCol[0]);
      pIter->base.pData = a;
    }else{
      int *pRc = &pIter->pIndex->rc;
      fts5BufferZero(&pIter->poslist);
      fts5IndexExtractColset(pRc, pColset, a, pSeg->nPos, &pIter->poslist);
      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }else{
    /* The data is distributed over two or more pages. Copy it into the
    ** Fts5Iter.poslist buffer and then set the output pointer to point
    ** to this buffer.  */
    fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex, pSeg, pColset, &pIter->poslist);
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = pIter->poslist.n;
  }
}